

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O3

void __thiscall
OctreeTracer::create_beam_render_pass(OctreeTracer *this,shared_ptr<myvk::Device> *device)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 local_108 [36];
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined8 uStack_d4;
  VkAttachmentDescription local_c8;
  VkRenderPassCreateInfo local_98;
  VkSubpassDescription local_58;
  
  local_98.pAttachments = &local_c8;
  local_c8.flags = 0;
  local_c8.format = VK_FORMAT_R32_SFLOAT;
  local_c8.samples = VK_SAMPLE_COUNT_1_BIT;
  local_c8.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_c8.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_c8.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  local_c8.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_c8.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_c8.finalLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  local_58.pColorAttachments = (VkAttachmentReference *)(local_108 + 0x18);
  local_108._24_8_ = (element_type *)0x200000000;
  local_98.pSubpasses = &local_58;
  local_58.pInputAttachments = (VkAttachmentReference *)0x0;
  local_58.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_58.pPreserveAttachments = (uint32_t *)0x0;
  local_58.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
  local_58.preserveAttachmentCount = 0;
  local_58._60_4_ = 0;
  local_58.flags = 0;
  local_58.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_58.inputAttachmentCount = 0;
  local_58._12_4_ = 0;
  local_58.colorAttachmentCount = 1;
  local_58._28_4_ = 0;
  local_98.pDependencies = (VkSubpassDependency *)(local_108 + 0x20);
  local_108._32_4_ = 0;
  uStack_e4 = 0xffffffff;
  uStack_e0 = 0x400;
  uStack_dc = 0x80;
  uStack_d8 = 0x100;
  uStack_d4 = 0x20;
  local_98.pNext = (void *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.flags = 0;
  local_98.attachmentCount = 1;
  local_98.subpassCount = 1;
  local_98._36_4_ = 0;
  local_98.dependencyCount = 1;
  local_98._52_4_ = 0;
  myvk::RenderPass::Create((RenderPass *)local_108,device,&local_98);
  uVar2 = local_108._8_8_;
  uVar1 = local_108._0_8_;
  local_108._0_8_ = (_func_int **)0x0;
  local_108._8_8_ = (element_type *)0x0;
  this_00 = (this->m_beam_render_pass).
            super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_beam_render_pass).super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar1;
  (this->m_beam_render_pass).super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
    }
  }
  return;
}

Assistant:

void OctreeTracer::create_beam_render_pass(const std::shared_ptr<myvk::Device> &device) {
	VkAttachmentDescription color_attachment = {};
	color_attachment.format = VK_FORMAT_R32_SFLOAT;
	color_attachment.samples = VK_SAMPLE_COUNT_1_BIT;
	color_attachment.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
	color_attachment.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
	color_attachment.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
	color_attachment.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
	color_attachment.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
	color_attachment.finalLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;

	VkAttachmentReference color_attachment_ref = {};
	color_attachment_ref.attachment = 0;
	color_attachment_ref.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;

	VkSubpassDescription subpass = {};
	subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	subpass.colorAttachmentCount = 1;
	subpass.pColorAttachments = &color_attachment_ref;
	subpass.pDepthStencilAttachment = nullptr;

	VkSubpassDependency subpass_dependency = {};
	subpass_dependency.srcSubpass = 0;
	subpass_dependency.dstSubpass = VK_SUBPASS_EXTERNAL;
	subpass_dependency.srcStageMask = VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
	subpass_dependency.dstStageMask = VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT;
	subpass_dependency.srcAccessMask = VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
	subpass_dependency.dstAccessMask = VK_ACCESS_SHADER_READ_BIT;

	VkRenderPassCreateInfo render_pass_info = {};
	render_pass_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	render_pass_info.attachmentCount = 1;
	render_pass_info.pAttachments = &color_attachment;
	render_pass_info.subpassCount = 1;
	render_pass_info.pSubpasses = &subpass;
	render_pass_info.dependencyCount = 1;
	render_pass_info.pDependencies = &subpass_dependency;

	m_beam_render_pass = myvk::RenderPass::Create(device, render_pass_info);
}